

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Action<unsigned_char_(unsigned_short)> * __thiscall
testing::internal::ReturnAction::operator_cast_to_Action
          (Action<unsigned_char_(unsigned_short)> *__return_storage_ptr__,ReturnAction *this)

{
  Impl<unsigned_char,_unsigned_char_(unsigned_short)> *this_00;
  ReturnAction<unsigned_char> *this_local;
  
  this_00 = (Impl<unsigned_char,_unsigned_char_(unsigned_short)> *)operator_new(0x10);
  ReturnAction<unsigned_char>::Impl<unsigned_char,_unsigned_char_(unsigned_short)>::Impl
            (this_00,(linked_ptr<unsigned_char> *)this);
  Action<unsigned_char_(unsigned_short)>::Action
            (__return_storage_ptr__,(ActionInterface<unsigned_char_(unsigned_short)> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

operator Action<F>() const {
    // Assert statement belongs here because this is the best place to verify
    // conditions on F. It produces the clearest error messages
    // in most compilers.
    // Impl really belongs in this scope as a local class but can't
    // because MSVC produces duplicate symbols in different translation units
    // in this case. Until MS fixes that bug we put Impl into the class scope
    // and put the typedef both here (for use in assert statement) and
    // in the Impl class. But both definitions must be the same.
    typedef typename Function<F>::Result Result;
    GTEST_COMPILE_ASSERT_(
        !is_reference<Result>::value,
        use_ReturnRef_instead_of_Return_to_return_a_reference);
    return Action<F>(new Impl<R, F>(value_));
  }